

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_getimage.c
# Opt level: O3

int gtTileSeparate(TIFFRGBAImage *img,uint32_t *raster,uint32_t w,uint32_t h)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  tmsize_t tVar4;
  char *module;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  TIFF *tif;
  uchar *puVar8;
  ulong uVar9;
  uint uVar10;
  uint32_t *puVar11;
  uint32_t y;
  uint32_t *puVar12;
  uint uVar13;
  int iVar14;
  byte bVar15;
  int iVar16;
  uint uVar17;
  uint32_t uVar18;
  bool bVar19;
  uint local_f8;
  uchar *local_e8;
  uint32_t th;
  uint32_t tw;
  uchar *local_d0;
  uchar *local_c8;
  uchar *local_c0;
  uchar *buf;
  ulong local_b0;
  uchar *local_a8;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  ulong local_90;
  ulong local_88;
  uint32_t *local_80;
  tmsize_t local_78;
  uchar *local_70;
  long local_68;
  tmsize_t local_60;
  TIFF *local_58;
  ulong local_50;
  uint32_t *local_48;
  anon_union_8_3_994a2fbf_for_put local_40;
  ulong local_38;
  
  tif = img->tif;
  local_40 = img->put;
  buf = (uchar *)0x0;
  iVar1 = img->alpha;
  local_78 = TIFFTileSize(tif);
  local_60 = _TIFFMultiplySSize(tif,4 - (ulong)(iVar1 == 0),local_78,"gtTileSeparate");
  if (local_60 == 0) {
    return 0;
  }
  TIFFGetField(tif,0x142,&tw);
  TIFFGetField(tif,0x143,&th);
  uVar3 = setorientation(img);
  if ((uVar3 & 1) == 0) {
    if (w + 0x7fffffff < tw) {
LAB_002a3f37:
      module = TIFFFileName(tif);
      TIFFErrorExtR(tif,module,"%s","unsupported tile size (too wide)");
      return 0;
    }
    uVar13 = w - tw;
    local_f8 = 0;
  }
  else {
    if ((int)(tw + w) < 0) goto LAB_002a3f37;
    local_f8 = h - 1;
    uVar13 = -(tw + w);
  }
  iVar14 = *(int *)&img->photometric;
  bVar19 = (ushort)iVar14 < 4;
  uVar10 = 3;
  if (bVar19) {
    uVar10 = (uint)(0x1000300010001 >> ((byte)(iVar14 << 4) & 0x3f));
  }
  uVar6 = (uint)img->col_offset % tw;
  if (h == 0) {
    iVar14 = 1;
  }
  else {
    bVar15 = bVar19 & 0xbU >> ((byte)iVar14 & 0xf);
    local_98 = tw - uVar6;
    local_a0 = uVar6 + uVar13;
    local_68 = local_78 * 3;
    local_94 = uVar10 & 0xffff;
    local_e8 = (uchar *)0x0;
    local_c8 = (uchar *)0x0;
    local_d0 = (uchar *)0x0;
    local_c0 = (uchar *)0x0;
    uVar7 = 0;
    local_b0 = (ulong)w;
    local_9c = uVar6;
    local_90 = (ulong)w;
    local_88 = (ulong)h;
    local_80 = raster;
    local_70 = (uchar *)(ulong)uVar13;
    local_58 = tif;
    do {
      iVar14 = (int)uVar7;
      iVar5 = th - (uint)(img->row_offset + iVar14) % th;
      iVar2 = (uint)local_88 - iVar14;
      if ((uint)(iVar5 + iVar14) <= (uint)local_88) {
        iVar2 = iVar5;
      }
      if ((int)local_b0 != 0) {
        uVar18 = img->col_offset;
        local_48 = local_80 + local_f8 * local_90;
        uVar6 = 0;
        puVar8 = (uchar *)(ulong)local_a0;
        uVar10 = local_9c;
        uVar13 = local_98;
        local_50 = uVar7;
        do {
          local_38 = (ulong)uVar13;
          iVar5 = (int)local_50;
          y = img->row_offset + iVar5;
          local_a8 = puVar8;
          if (buf != (uchar *)0x0) {
            tVar4 = TIFFReadTile(tif,local_e8,uVar18,y,0,0);
            if ((tVar4 != -1) || (img->stoponerr == 0)) {
              if (bVar15 == 0) goto LAB_002a3d3e;
              goto LAB_002a3daa;
            }
LAB_002a3f62:
            iVar14 = 0;
            goto LAB_002a3f65;
          }
          tVar4 = _TIFFReadTileAndAllocBuffer(tif,&buf,local_60,uVar18,y,0,0);
          local_e8 = buf;
          if ((tVar4 == -1) && ((iVar14 = 0, buf == (uchar *)0x0 || (img->stoponerr != 0))))
          goto LAB_002a3f65;
          if (bVar15 == 0) {
            local_c8 = buf + local_78;
            local_d0 = local_c8 + local_78;
            local_c0 = (uchar *)0x0;
            if (iVar1 != 0) {
              local_c0 = local_d0 + local_78;
            }
LAB_002a3d3e:
            tVar4 = TIFFReadTile(tif,local_c8,uVar18,img->row_offset + iVar5,0,1);
            if (((tVar4 == -1) && (img->stoponerr != 0)) ||
               ((tVar4 = TIFFReadTile(tif,local_d0,uVar18,img->row_offset + iVar5,0,2), tVar4 == -1
                && (img->stoponerr != 0)))) goto LAB_002a3f62;
          }
          else {
            local_c0 = (uchar *)0x0;
            if (iVar1 != 0) {
              local_c0 = buf + local_68;
            }
            local_c8 = buf;
            local_d0 = buf;
          }
LAB_002a3daa:
          if (((iVar1 != 0) &&
              (tVar4 = TIFFReadTile(tif,local_c0,uVar18,img->row_offset + iVar5,0,(uint16_t)local_94
                                   ), tVar4 == -1)) && (img->stoponerr != 0)) goto LAB_002a3f62;
          iVar14 = img->row_offset;
          uVar7 = (ulong)th;
          tVar4 = TIFFTileRowSize(tif);
          uVar17 = (uint)local_b0;
          iVar16 = uVar17 - uVar6;
          if ((int)local_38 + uVar6 <= uVar17) {
            iVar16 = (int)local_38;
          }
          local_a8 = local_e8 +
                     (ulong)img->samplesperpixel * (long)(int)uVar10 +
                     tVar4 * ((ulong)(uint)(iVar14 + iVar5) % uVar7);
          (*local_40.any)(img);
          iVar14 = (int)local_50;
          uVar6 = uVar6 + iVar16;
          uVar18 = uVar18 + iVar16;
          uVar10 = 0;
          tif = local_58;
          puVar8 = local_70;
          uVar13 = tw;
        } while (uVar6 < uVar17);
      }
      iVar5 = -iVar2;
      if ((uVar3 & 1) == 0) {
        iVar5 = iVar2;
      }
      local_f8 = local_f8 + iVar5;
      uVar7 = (ulong)(uint)(iVar14 + iVar2);
    } while ((uint)(iVar14 + iVar2) < (uint)local_88);
    iVar14 = 1;
LAB_002a3f65:
    if (1 < uVar3) {
      uVar7 = 0;
      uVar9 = 0;
      do {
        puVar11 = local_80 + (uint)((int)uVar9 * (int)local_b0) + (local_90 - 1);
        if (local_80 + (uint)((int)uVar9 * (int)local_b0) < puVar11) {
          puVar12 = local_80 + uVar7 + 1;
          do {
            uVar18 = puVar12[-1];
            puVar12[-1] = *puVar11;
            *puVar11 = uVar18;
            puVar11 = puVar11 + -1;
            bVar19 = puVar12 < puVar11;
            puVar12 = puVar12 + 1;
          } while (bVar19);
        }
        uVar9 = uVar9 + 1;
        uVar7 = (ulong)(uint)((int)uVar7 + (int)local_b0);
      } while (uVar9 != (local_88 & 0xffffffff));
    }
  }
  _TIFFfreeExt(img->tif,buf);
  return iVar14;
}

Assistant:

static int gtTileSeparate(TIFFRGBAImage *img, uint32_t *raster, uint32_t w,
                          uint32_t h)
{
    TIFF *tif = img->tif;
    tileSeparateRoutine put = img->put.separate;
    uint32_t col, row, y, rowstoread;
    tmsize_t pos;
    uint32_t tw, th;
    unsigned char *buf = NULL;
    unsigned char *p0 = NULL;
    unsigned char *p1 = NULL;
    unsigned char *p2 = NULL;
    unsigned char *pa = NULL;
    tmsize_t tilesize;
    tmsize_t bufsize;
    int32_t fromskew, toskew;
    int alpha = img->alpha;
    uint32_t nrow;
    int ret = 1, flip;
    uint16_t colorchannels;
    uint32_t this_tw, tocol;
    int32_t this_toskew, leftmost_toskew;
    int32_t leftmost_fromskew;
    uint32_t leftmost_tw;

    tilesize = TIFFTileSize(tif);
    bufsize =
        _TIFFMultiplySSize(tif, alpha ? 4 : 3, tilesize, "gtTileSeparate");
    if (bufsize == 0)
    {
        return (0);
    }

    TIFFGetField(tif, TIFFTAG_TILEWIDTH, &tw);
    TIFFGetField(tif, TIFFTAG_TILELENGTH, &th);

    flip = setorientation(img);
    if (flip & FLIP_VERTICALLY)
    {
        if ((tw + w) > INT_MAX)
        {
            TIFFErrorExtR(tif, TIFFFileName(tif), "%s",
                          "unsupported tile size (too wide)");
            return (0);
        }
        y = h - 1;
        toskew = -(int32_t)(tw + w);
    }
    else
    {
        if (tw > (INT_MAX + w))
        {
            TIFFErrorExtR(tif, TIFFFileName(tif), "%s",
                          "unsupported tile size (too wide)");
            return (0);
        }
        y = 0;
        toskew = -(int32_t)(tw - w);
    }

    switch (img->photometric)
    {
        case PHOTOMETRIC_MINISWHITE:
        case PHOTOMETRIC_MINISBLACK:
        case PHOTOMETRIC_PALETTE:
            colorchannels = 1;
            break;

        default:
            colorchannels = 3;
            break;
    }

    /*
     *	Leftmost tile is clipped on left side if col_offset > 0.
     */
    leftmost_fromskew = img->col_offset % tw;
    leftmost_tw = tw - leftmost_fromskew;
    leftmost_toskew = toskew + leftmost_fromskew;
    for (row = 0; ret != 0 && row < h; row += nrow)
    {
        rowstoread = th - (row + img->row_offset) % th;
        nrow = (row + rowstoread > h ? h - row : rowstoread);
        fromskew = leftmost_fromskew;
        this_tw = leftmost_tw;
        this_toskew = leftmost_toskew;
        tocol = 0;
        col = img->col_offset;
        while (tocol < w)
        {
            if (buf == NULL)
            {
                if (_TIFFReadTileAndAllocBuffer(tif, (void **)&buf, bufsize,
                                                col, row + img->row_offset, 0,
                                                0) == (tmsize_t)(-1) &&
                    (buf == NULL || img->stoponerr))
                {
                    ret = 0;
                    break;
                }
                p0 = buf;
                if (colorchannels == 1)
                {
                    p2 = p1 = p0;
                    pa = (alpha ? (p0 + 3 * tilesize) : NULL);
                }
                else
                {
                    p1 = p0 + tilesize;
                    p2 = p1 + tilesize;
                    pa = (alpha ? (p2 + tilesize) : NULL);
                }
            }
            else if (TIFFReadTile(tif, p0, col, row + img->row_offset, 0, 0) ==
                         (tmsize_t)(-1) &&
                     img->stoponerr)
            {
                ret = 0;
                break;
            }
            if (colorchannels > 1 &&
                TIFFReadTile(tif, p1, col, row + img->row_offset, 0, 1) ==
                    (tmsize_t)(-1) &&
                img->stoponerr)
            {
                ret = 0;
                break;
            }
            if (colorchannels > 1 &&
                TIFFReadTile(tif, p2, col, row + img->row_offset, 0, 2) ==
                    (tmsize_t)(-1) &&
                img->stoponerr)
            {
                ret = 0;
                break;
            }
            if (alpha &&
                TIFFReadTile(tif, pa, col, row + img->row_offset, 0,
                             colorchannels) == (tmsize_t)(-1) &&
                img->stoponerr)
            {
                ret = 0;
                break;
            }

            pos = ((row + img->row_offset) % th) * TIFFTileRowSize(tif) +
                  ((tmsize_t)fromskew * img->samplesperpixel);
            if (tocol + this_tw > w)
            {
                /*
                 * Rightmost tile is clipped on right side.
                 */
                fromskew = tw - (w - tocol);
                this_tw = tw - fromskew;
                this_toskew = toskew + fromskew;
            }
            tmsize_t roffset = (tmsize_t)y * w + tocol;
            (*put)(img, raster + roffset, tocol, y, this_tw, nrow, fromskew,
                   this_toskew, p0 + pos, p1 + pos, p2 + pos,
                   (alpha ? (pa + pos) : NULL));
            tocol += this_tw;
            col += this_tw;
            /*
             * After the leftmost tile, tiles are no longer clipped on left
             * side.
             */
            fromskew = 0;
            this_tw = tw;
            this_toskew = toskew;
        }

        y += ((flip & FLIP_VERTICALLY) ? -(int32_t)nrow : (int32_t)nrow);
    }

    if (flip & FLIP_HORIZONTALLY)
    {
        uint32_t line;

        for (line = 0; line < h; line++)
        {
            uint32_t *left = raster + (line * w);
            uint32_t *right = left + w - 1;

            while (left < right)
            {
                uint32_t temp = *left;
                *left = *right;
                *right = temp;
                left++;
                right--;
            }
        }
    }

    _TIFFfreeExt(img->tif, buf);
    return (ret);
}